

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar2;
  ostream *poVar3;
  ssize_t sVar4;
  Scalar *pSVar5;
  void *__buf;
  ulong uVar6;
  char *pcVar7;
  float *j_max_limits_00;
  int j;
  int iVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 local_270;
  float local_268;
  Scalar local_260;
  undefined8 local_258;
  float local_250;
  float local_24c;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  Waypoints;
  Scalar local_228;
  float local_220;
  float j_max_limits [3];
  float j_min_limits [3];
  vector<unsigned_char,_std::allocator<unsigned_char>_> current_position;
  vector<unsigned_char,_std::allocator<unsigned_char>_> commanded_position;
  vector<float,_std::allocator<float>_> p1_1;
  vector<float,_std::allocator<float>_> p1;
  MatrixXd m1;
  DenseStorage<double,__1,__1,__1,_0> local_168;
  Connection s1;
  float local_128;
  float fStack_124;
  Scalar local_118;
  Scalar local_110;
  Scalar local_108;
  Scalar local_100;
  Robot R1;
  char input_file [60];
  
  Waypoints.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Waypoints.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Waypoints.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  commanded_position.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commanded_position.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  commanded_position.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  current_position.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  current_position.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  current_position.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  j_min_limits[0] = -3.1415927;
  j_min_limits[1] = -1.5707964;
  j_min_limits[2] = -3.1415927;
  j_max_limits[0] = 3.1415927;
  j_max_limits[1] = 1.5707964;
  j_max_limits[2] = 3.1415927;
  builtin_strncpy(input_file + 0x20,"tracking/input.txt",0x13);
  input_file[0x33] = '\0';
  input_file[0x34] = '\0';
  input_file[0x35] = '\0';
  input_file[0x36] = '\0';
  input_file[0x37] = '\0';
  input_file[0x38] = '\0';
  input_file[0x39] = '\0';
  input_file[0x3a] = '\0';
  input_file[0x3b] = '\0';
  builtin_strncpy(input_file + 0x10,"t_Ik_trajectory_",0x10);
  builtin_strncpy(input_file,"/home/gokul/Robo",0x10);
  trajectory_waypoints
            ((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)&R1,input_file);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::_M_move_assign(&Waypoints,&R1);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *)&R1);
  R1.no_of_joints = 3;
  s1.socket_status = true;
  s1.socket_open = false;
  s1._2_2_ = 0;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&m1,&R1.no_of_joints,(int *)&s1);
  R1.Dh_params.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  uVar6 = 1;
  R1.Dh_params.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 1
  ;
  R1.Dh_params.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 1
  ;
  *m1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       1.5707963267948966;
  s1.socket_status = false;
  s1.socket_open = false;
  s1._2_6_ = 0x402400000000;
  R1._0_8_ = (Matrix<double,_1,_1,0,_1,_1> *)&m1;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&R1,
                      (Scalar *)&s1);
  p1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,(Scalar *)&p1);
  p1_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,(Scalar *)&p1_1);
  local_270 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,(Scalar *)&local_270);
  local_258 = 5.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,(Scalar *)&local_258);
  local_228 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_228);
  local_260 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_260);
  local_100 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_100);
  local_108 = 5.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_108);
  local_110 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_110);
  local_118 = 0.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar2,&local_118);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&R1);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_168,(DenseStorage<double,__1,__1,__1,_0> *)&m1);
  j_max_limits_00 = j_max_limits;
  Robot::Robot(&R1,3,(MatrixXd *)&local_168,j_min_limits,j_max_limits_00);
  free(local_168.m_data);
  Connection::Connection(&s1,3);
  local_268 = 0.0;
  local_270 = 0.0;
  pSVar5 = (Scalar *)
           ((Waypoints.
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  local_258 = *pSVar5;
  local_250 = *(float *)(pSVar5 + 1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,SUB84(local_258,0));
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_258._4_4_);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_250);
  std::endl<char,std::char_traits<char>>(poVar3);
  Robot::closest_IK_solutions(&p1,&R1,(float *)&local_270,(float *)&local_258);
  local_270 = *(Scalar *)
               p1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
               _M_start;
  local_268 = p1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start[2];
  do {
    if ((ulong)(((long)Waypoints.
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)Waypoints.
                      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar6) {
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&p1.super__Vector_base<float,_std::allocator<float>_>);
      Connection::~Connection(&s1);
      Robot::~Robot(&R1);
      free(m1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&current_position.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                );
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&commanded_position.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::~vector(&Waypoints);
      return 0;
    }
    pSVar5 = (Scalar *)
             Waypoints.
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar6].
             super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start;
    fVar9 = *(float *)((long)pSVar5 + 0xc) * 50.0;
    local_228 = *pSVar5;
    local_220 = *(float *)(pSVar5 + 1);
    pSVar5 = &local_228;
    Robot::closest_IK_solutions(&p1_1,&R1,(float *)&local_270,(float *)pSVar5);
    auVar10._0_4_ =
         (float)*(undefined8 *)
                 p1_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start - SUB84(local_270,0);
    auVar10._4_4_ =
         (float)((ulong)*(undefined8 *)
                         p1_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start >> 0x20) -
         (float)((ulong)local_270 >> 0x20);
    auVar10._8_8_ = 0;
    auVar11._4_4_ = fVar9;
    auVar11._0_4_ = fVar9;
    auVar11._8_4_ = fVar9;
    auVar11._12_4_ = fVar9;
    auVar11 = divps(auVar10,auVar11);
    local_24c = (p1_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[2] - local_268) / fVar9;
    for (iVar8 = 0; (float)iVar8 < fVar9; iVar8 = iVar8 + 1) {
      iVar1 = Connection::receive(&s1,&current_position);
      if (iVar1 == 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Unable to read the current position");
        std::endl<char,std::char_traits<char>>(poVar3);
        break;
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"Current position received successfully");
      std::endl<char,std::char_traits<char>>(poVar3);
      local_128 = auVar11._0_4_;
      fStack_124 = auVar11._4_4_;
      local_128 = SUB84(local_270,0) + local_128;
      local_270 = (Scalar)CONCAT44((float)((ulong)local_270 >> 0x20) + fStack_124,local_128);
      local_268 = local_268 + local_24c;
      local_260._0_1_ = (char)(int)local_128;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&commanded_position,(uchar *)&local_260);
      local_260._0_1_ = (undefined1)(int)local_270._4_4_;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&commanded_position,(uchar *)&local_260);
      local_260 = (Scalar)CONCAT71(local_260._1_7_,(char)(int)local_268);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&commanded_position,(uchar *)&local_260);
      poVar3 = std::operator<<((ostream *)&std::cout,"Waypoint ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)uVar6);
      poVar3 = std::operator<<(poVar3,":Joint_angles");
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(float)local_270);
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_270._4_4_);
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_268);
      std::endl<char,std::char_traits<char>>(poVar3);
      sVar4 = Connection::send(&s1,(int)&commanded_position,__buf,(size_t)pSVar5,
                               (int)j_max_limits_00);
      pcVar7 = "Commanded successfully";
      if ((int)sVar4 == 0) {
        pcVar7 = "Socket communication failure";
      }
      poVar3 = std::operator<<((ostream *)&std::cout,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&p1_1.super__Vector_base<float,_std::allocator<float>_>);
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

int main() {
    // Vector for extracting the waypoints
    std::vector<std::vector<float> > Waypoints;
    std::vector<unsigned char > commanded_position;
    std::vector<unsigned char > current_position;

    bool is_running = true;

    //Assign the joint limits
    float j_min_limits[3] = {-M_PI, -M_PI / 2, -M_PI};
    float j_max_limits[3] = {M_PI, M_PI / 2, M_PI};

    //Location of the file which has the trajectory
    char input_file[60] = "/home/gokul/Robot_Ik_trajectory_tracking/input.txt";
    float t = 0;
    Waypoints = trajectory_waypoints(input_file);

    //Create an Eigen matrix to store the DH parameters
    Eigen::MatrixXd m1(3, 4);
    m1 << M_PI / 2, 10, 0, 0, 0, 5, 0, 0, 0, 5, 0, 0;

    //Initialize the robot with DH param and joint limits
    Robot R1(3, m1, j_min_limits, j_max_limits);

    //Create a connection with packet data size 3(three angles)
    Connection s1(3);

    //Command the robot to the start point of the trajectory
    float current[] = {0, 0, 0};

    //Extract the start point of trajectory
    float start_waypoint[] = {Waypoints[0][0], Waypoints[0][1], Waypoints[0][2]};
    std::cout<<start_waypoint[0]<<std::endl;
    std::cout<<start_waypoint[1]<<std::endl;
    std::cout<<start_waypoint[2]<<std::endl;

    //Initialize joint angle increment
    float joint_angle_increment[] = {0, 0, 0};

    //Find the joint angles for the start position
    std::vector<float> p1 = R1.closest_IK_solutions(current,start_waypoint) ;

    //Assign the start position
    current[0]=p1[0];
    current[1]=p1[1];
    current[2]=p1[2];

    //Joint space trajectory control
    //Follow the trajectory
    for (int i = 1; i < Waypoints.size(); i++) {
        float t_prev = t;
        float t = Waypoints[i][3];
        float time_step = (t - t_prev) * 50;
        float next_waypoint[] = {Waypoints[i][0], Waypoints[i][1], Waypoints[i][2]};

        //Extract the joint angles of the waypoints
        std::vector<float> p1 = R1.closest_IK_solutions(current, next_waypoint);

        //Find the joint angle increment based on the time between 2 waypoints
        //Assuming that the robot is always able to go to the commanded position in the specific time
        joint_angle_increment[0] = (p1[0] - current[0]) / time_step;
        joint_angle_increment[1] = (p1[1] - current[1]) / time_step;
        joint_angle_increment[2] = (p1[2] - current[2]) / time_step;

        for(int j=0;j<time_step;j++) {

            // Receive the current position from the robot
            if(s1.receive(current_position))
                std::cout<<"Current position received successfully"<<std::endl;
            else
            {
                std::cout<<"Unable to read the current position"<<std::endl;
                break;
            }

            //Increment the current position
            current[0] = current[0] + joint_angle_increment[0];
            current[1] = current[1] + joint_angle_increment[1];
            current[2] = current[2] + joint_angle_increment[2];

            commanded_position.push_back(current[0]);
            commanded_position.push_back(current[1]);
            commanded_position.push_back(current[2]);

            std::cout << "Waypoint " << i << ":Joint_angles" << std::endl;
            std::cout << current[0] << std::endl;
            std::cout << current[1] << std::endl;
            std::cout << current[2] << std::endl;

            //Send the calculated joint angle through the socket
            if(s1.send(commanded_position))
            {
                cout<<"Commanded successfully"<<std::endl;
            } else
            {
                cout<<"Socket communication failure"<<std::endl;
            }

        }
    }

    return 0;

}